

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O3

double __thiscall OpenDataServerCommand::execute(OpenDataServerCommand *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sockaddr local_58;
  undefined1 auStack_48 [8];
  sockaddr_in client_adress;
  socklen_t local_2c;
  thread tStack_28;
  int clientLength;
  thread data_server_thread;
  
  auStack_48._0_2_ = 0;
  auStack_48[2] = '\0';
  auStack_48[3] = '\0';
  auStack_48[4] = '\0';
  auStack_48[5] = '\0';
  auStack_48[6] = '\0';
  auStack_48[7] = '\0';
  client_adress.sin_family = 0;
  client_adress.sin_port = 0;
  client_adress.sin_addr.s_addr = 0;
  iVar1 = socket(2,1,0);
  if (iVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not create a socket",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    uVar3 = 0xbff00000;
  }
  else {
    local_58.sa_data[6] = '\0';
    local_58.sa_data[7] = '\0';
    local_58.sa_data[8] = '\0';
    local_58.sa_data[9] = '\0';
    local_58.sa_data[10] = '\0';
    local_58.sa_data[0xb] = '\0';
    local_58.sa_data[0xc] = '\0';
    local_58.sa_data[0xd] = '\0';
    local_58.sa_family = 2;
    local_58.sa_data[2] = '\0';
    local_58.sa_data[3] = '\0';
    local_58.sa_data[4] = '\0';
    local_58.sa_data[5] = '\0';
    local_58.sa_data._0_2_ = this->port << 8 | this->port >> 8;
    iVar2 = bind(iVar1,&local_58,0x10);
    if (iVar2 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not bind the socket to an IP",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      uVar3 = 0xc0000000;
    }
    else {
      iVar2 = listen(iVar1,5);
      if (iVar2 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error during listening command",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
        uVar3 = 0xc0080000;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Server is now listening ...",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        local_2c = 0x10;
        iVar1 = accept(iVar1,(sockaddr *)auStack_48,&local_2c);
        this->client_socket = iVar1;
        this->client_socket_pointer = &this->client_socket;
        if (iVar1 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error accepting client",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
          std::ostream::put(-0x38);
          std::ostream::flush();
          uVar3 = 0xc0100000;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"accepted ...",0xc);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          std::thread::thread<void*(&)(int*),int*&,void>
                    (&stack0xffffffffffffffd8,readFromServer,&this->client_socket_pointer);
          std::thread::detach();
          if (tStack_28._M_id._M_thread != 0) {
            std::terminate();
          }
          uVar3 = 0;
        }
      }
    }
  }
  return (double)((ulong)uVar3 << 0x20);
}

Assistant:

double OpenDataServerCommand::execute() {
  //create socket
  struct sockaddr_in serv_address{}, client_adress{};
  int socketfd = socket(AF_INET, SOCK_STREAM, 0);
  if (socketfd == -1) {
    //error
    cerr << "Could not create a socket" << endl;
    return -1;
  }
  
  //bind socket to IP address
  bzero((char *) &serv_address, sizeof(serv_address));
  serv_address.sin_family = AF_INET;
  serv_address.sin_addr.s_addr =
      INADDR_ANY; //give me any IP allocated for my machine
  serv_address.sin_port = htons(this->port);
  
  //the actual bind command
  if (bind(socketfd, (struct sockaddr *) &serv_address, sizeof(serv_address))
      == -1) {
    cerr << "Could not bind the socket to an IP" << endl;
    return -2;
  }

  //making socket listen to the port
  if (listen(socketfd, 5) == -1) {
    cerr << "Error during listening command" << endl;
    return -3;
  } else {
    cout << "Server is now listening ..." << endl;
  }

  // accepting a client
  int clientLength = sizeof(client_adress);
  this->client_socket = accept(socketfd, (struct sockaddr *) &client_adress,
                               (socklen_t *) &clientLength);
  this->client_socket_pointer = &client_socket;
  if (this->client_socket == -1) {
    cerr << "Error accepting client" << endl;
    return -4;
  } else {
    cout << "accepted ..." << endl;
  }
  // create the thread
  thread data_server_thread(readFromServer, client_socket_pointer);
  data_server_thread.detach();
  return 0;
}